

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<long>::Swap(RepeatedField<long> *this,RepeatedField<long> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  RepeatedField<long> temp;
  RepeatedField<long> RStack_28;
  
  if (this != other) {
    pAVar1 = GetArena(this);
    pAVar2 = GetArena(other);
    if (pAVar1 == pAVar2) {
      InternalSwap(this,other);
      return;
    }
    pAVar1 = GetArena(other);
    RepeatedField(&RStack_28,pAVar1);
    MergeFrom(&RStack_28,this);
    CopyFrom(this,other);
    UnsafeArenaSwap(other,&RStack_28);
    ~RepeatedField(&RStack_28);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArena() == other->GetArena()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArena());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}